

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# City.cpp
# Opt level: O2

void CityHashCrc256Long(char *s,size_t len,uint32 seed,uint64 *result)

{
  uint64 uVar1;
  ulong uVar2;
  long lVar3;
  uint64 uVar4;
  uint64 uVar5;
  undefined8 uVar6;
  long lVar7;
  undefined8 uVar8;
  long *plVar9;
  undefined8 uVar10;
  long lVar11;
  ulong uVar12;
  uint64 uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined8 uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  undefined8 uVar20;
  uint64 uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint64 old_a;
  uint64 u;
  uint64 old_a_1;
  long local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  uint64 local_50;
  
  local_58 = *(long *)(s + 0x60) + 0xc3a5c85c97cb3127;
  local_50 = *(long *)(s + 0x38) + 0xc3a5c85c97cb3127;
  uVar1 = HashLen16(local_58,len);
  *result = uVar1;
  lVar19 = 0;
  local_70 = 0;
  uVar15 = (ulong)seed;
  uVar21 = *(long *)(s + 0x78) * -0x3c5a37a36834ced9 + len;
  result[1] = uVar21;
  local_60 = uVar1 + uVar21;
  uVar2 = len / 0xf0;
  lVar11 = 0;
  uVar23 = *(long *)(s + 0xb8) + uVar15;
  lVar3 = uVar2 * 0xf0;
  lVar7 = 0;
  plVar9 = (long *)s;
  do {
    uVar18 = (uVar23 >> 0x20 | uVar23 << 0x20) + plVar9[3];
    uVar17 = (uVar21 >> 0x28 | uVar21 << 0x18) + plVar9[2];
    uVar14 = (uVar1 >> 0x1a | uVar1 << 0x26) + plVar9[1];
    uVar23 = (local_58 >> 0x28 | local_58 << 0x18) + *plVar9;
    uVar24 = (local_60 >> 0x18 | local_60 << 0x28) + plVar9[4];
    uVar22 = (local_50 >> 0x19 | local_50 << 0x27) * -0x3c5a37a36834ced9 + plVar9[9];
    uVar16 = crc32(local_70,uVar18);
    uVar10 = crc32(lVar11,uVar17);
    uVar8 = crc32(lVar19,uVar14);
    uVar12 = (uVar23 >> 0x18 | uVar23 << 0x28) + plVar9[0xe];
    uVar20 = crc32(uVar15,uVar23);
    uVar6 = crc32(lVar7,uVar24);
    uVar18 = (uVar18 >> 0x29 | uVar18 * 0x800000) * -0x3c5a37a36834ced9 + plVar9[7];
    uVar23 = (uVar17 >> 0x1b | uVar17 << 0x25) * -0x3c5a37a36834ced9 + plVar9[6];
    uVar15 = (uVar14 >> 0x29 | uVar14 * 0x800000) * -0x3c5a37a36834ced9 + plVar9[5];
    uVar24 = (uVar24 >> 0x21 | uVar24 * 0x80000000) * -0x3c5a37a36834ced9 + plVar9[8];
    uVar6 = crc32(uVar6,uVar22);
    uVar22 = (uVar22 >> 0x20 | uVar22 << 0x20) + plVar9[0xd];
    uVar10 = crc32(uVar10,uVar18);
    uVar17 = (uVar18 >> 0x1a | uVar18 << 0x26) + plVar9[0xb];
    uVar8 = crc32(uVar8,uVar23);
    uVar14 = (uVar23 >> 0x28 | uVar23 * 0x1000000) + plVar9[10];
    uVar20 = crc32(uVar20,uVar15);
    uVar16 = crc32(uVar16,uVar24);
    uVar18 = (uVar24 >> 0x28 | uVar24 * 0x1000000) + plVar9[0xc];
    uVar23 = (uVar15 >> 0x19 | uVar15 << 0x27) * -0x3c5a37a36834ced9 + plVar9[0x13];
    uVar6 = crc32(uVar6,uVar12);
    uVar16 = crc32(uVar16,uVar22);
    uVar8 = crc32(uVar8,uVar17);
    uVar20 = crc32(uVar20,uVar14);
    uVar14 = (uVar14 >> 0x18 | uVar14 << 0x28) + plVar9[0x18];
    uVar10 = crc32(uVar10,uVar18);
    uVar15 = (uVar17 >> 0x29 | uVar17 * 0x800000) * -0x3c5a37a36834ced9 + plVar9[0xf];
    uVar6 = crc32(uVar6,uVar23);
    uVar23 = (uVar23 >> 0x20 | uVar23 << 0x20) + plVar9[0x17];
    uVar17 = (uVar18 >> 0x1b | uVar18 << 0x25) * -0x3c5a37a36834ced9 + plVar9[0x10];
    uVar22 = (uVar22 >> 0x29 | uVar22 * 0x800000) * -0x3c5a37a36834ced9 + plVar9[0x11];
    uVar18 = (uVar12 >> 0x21 | uVar12 * 0x80000000) * -0x3c5a37a36834ced9 + plVar9[0x12];
    uVar6 = crc32(uVar6,uVar14);
    uVar20 = crc32(uVar20,uVar15);
    uVar8 = crc32(uVar8,uVar17);
    uVar12 = (uVar22 >> 0x1a | uVar22 << 0x26) + plVar9[0x15];
    local_60 = (uVar17 >> 0x28 | uVar17 * 0x1000000) + plVar9[0x14];
    uVar10 = crc32(uVar10,uVar22);
    uVar17 = (uVar18 >> 0x28 | uVar18 * 0x1000000) + plVar9[0x16];
    uVar16 = crc32(uVar16,uVar18);
    uVar1 = (uVar23 >> 0x29 | uVar23 * 0x800000) * -0x3c5a37a36834ced9 + plVar9[0x1b];
    uVar21 = (uVar14 >> 0x21 | uVar14 * 0x80000000) * -0x3c5a37a36834ced9 + plVar9[0x1c];
    uVar16 = crc32(uVar16,uVar23);
    uVar8 = crc32(uVar8,uVar12);
    uVar20 = crc32(uVar20,local_60);
    uVar10 = crc32(uVar10,uVar17);
    local_50 = (uVar12 >> 0x29 | uVar12 * 0x800000) * -0x3c5a37a36834ced9 + plVar9[0x19];
    local_70 = crc32(uVar16,uVar21);
    lVar11 = crc32(uVar10,uVar1);
    local_58 = (uVar17 >> 0x1b | uVar17 << 0x25) * -0x3c5a37a36834ced9 + plVar9[0x1a];
    uVar23 = (uVar15 >> 0x19 | uVar15 << 0x27) * -0x3c5a37a36834ced9 + plVar9[0x1d];
    plVar9 = plVar9 + 0x1e;
    uVar15 = crc32(uVar20,local_50);
    lVar19 = crc32(uVar8,local_58);
    lVar7 = crc32(uVar6,uVar23);
    uVar2 = uVar2 - 1;
  } while (uVar2 != 0);
  local_68 = len % 0xf0;
  plVar9 = (long *)(s + lVar3);
  while( true ) {
    uVar17 = local_60 >> 0x19 | local_60 << 0x27;
    uVar2 = local_58 >> 0x29 | local_58 << 0x17;
    uVar18 = uVar1 >> 0x1b | uVar1 << 0x25;
    uVar12 = uVar21 >> 0x29 | uVar21 << 0x17;
    uVar14 = uVar23 >> 0x21 | uVar23 << 0x1f;
    if (local_68 < 0x28) break;
    uVar21 = uVar14 * -0x3c5a37a36834ced9 + plVar9[3];
    uVar1 = uVar12 * -0x3c5a37a36834ced9 + plVar9[2];
    uVar4 = uVar2 * -0x3c5a37a36834ced9 + *plVar9;
    local_58 = uVar18 * -0x3c5a37a36834ced9 + plVar9[1];
    uVar23 = uVar17 * -0x3c5a37a36834ced9 + plVar9[4];
    local_68 = local_68 - 0x28;
    plVar9 = plVar9 + 5;
    local_70 = crc32(local_70,uVar21);
    local_60 = local_50;
    uVar15 = crc32(uVar15,uVar4);
    lVar19 = crc32(lVar19,local_58);
    lVar11 = crc32(lVar11,uVar1);
    lVar7 = crc32(lVar7,uVar23);
    local_50 = uVar4;
  }
  if (local_68 != 0) {
    local_58 = uVar18 * -0x3c5a37a36834ced9 + *(long *)((long)plVar9 + (local_68 - 0x20));
    uVar1 = uVar12 * -0x3c5a37a36834ced9 + *(long *)((long)plVar9 + (local_68 - 0x18));
    uVar23 = uVar17 * -0x3c5a37a36834ced9 + *(long *)((long)plVar9 + (local_68 - 8));
    uVar4 = uVar2 * -0x3c5a37a36834ced9 + *(long *)((long)plVar9 + (local_68 - 0x28));
    uVar21 = uVar14 * -0x3c5a37a36834ced9 + *(long *)((long)plVar9 + (local_68 - 0x10));
    uVar15 = crc32(uVar15,uVar4);
    lVar19 = crc32(lVar19,local_58);
    lVar11 = crc32(lVar11,uVar1);
    local_70 = crc32(local_70,uVar21);
    lVar7 = crc32(lVar7,uVar23);
    local_60 = local_50;
    local_50 = uVar4;
  }
  uVar13 = (local_70 << 0x20) + lVar7;
  uVar4 = HashLen16(local_50,uVar13);
  u = (lVar19 << 0x20) + lVar11;
  uVar1 = HashLen16(uVar1,uVar15);
  uVar1 = uVar1 + local_70;
  uVar21 = HashLen16(uVar21,*result + uVar23);
  uVar13 = uVar13 + uVar23;
  uVar5 = HashLen16(u,local_60);
  uVar21 = HashLen16(uVar4,uVar21);
  lVar7 = uVar21 + uVar13;
  uVar21 = HashLen16(local_58 + u,uVar1);
  uVar5 = HashLen16(uVar13,local_70 + uVar5);
  lVar3 = uVar4 + uVar1 + uVar5;
  uVar15 = lVar3 * -0x3c5a37a36834ced9;
  uVar21 = uVar21 + u + lVar3 + lVar7;
  *result = uVar21;
  lVar3 = (uVar15 >> 0x2f ^ uVar15) * -0x3c5a37a36834ced9 + local_58 + u;
  uVar21 = uVar21 + result[1] + lVar3;
  uVar15 = lVar3 * -0x3c5a37a36834ced9;
  result[1] = uVar21;
  lVar3 = (uVar15 >> 0x2f ^ uVar15) * -0x3c5a37a36834ced9 + uVar1;
  uVar21 = uVar21 + lVar3;
  uVar15 = (lVar3 + lVar7) * -0x3c5a37a36834ced9;
  result[2] = uVar21;
  result[3] = (uVar15 >> 0x2f ^ uVar15) * -0x3c5a37a36834ced9 + uVar21;
  return;
}

Assistant:

static void CityHashCrc256Long(const char *s, size_t len,
                               uint32 seed, uint64 *result) {
  uint64 a = Fetch64(s + 56) + k0;
  uint64 b = Fetch64(s + 96) + k0;
  uint64 c = result[0] = HashLen16(b, len);
  uint64 d = result[1] = Fetch64(s + 120) * k0 + len;
  uint64 e = Fetch64(s + 184) + seed;
  uint64 f = seed;
  uint64 g = 0;
  uint64 h = 0;
  uint64 i = 0;
  uint64 j = 0;
  uint64 t = c + d;

  // 240 bytes of input per iter.
  size_t iters = len / 240;
  len -= iters * 240;
  do {
#define CHUNK(multiplier, z)                                    \
    {                                                           \
      uint64 old_a = a;                                         \
      a = Rotate(b, 41 ^ z) * multiplier + Fetch64(s);          \
      b = Rotate(c, 27 ^ z) * multiplier + Fetch64(s + 8);      \
      c = Rotate(d, 41 ^ z) * multiplier + Fetch64(s + 16);     \
      d = Rotate(e, 33 ^ z) * multiplier + Fetch64(s + 24);     \
      e = Rotate(t, 25 ^ z) * multiplier + Fetch64(s + 32);     \
      t = old_a;                                                \
    }                                                           \
    f = _mm_crc32_u64(f, a);                                    \
    g = _mm_crc32_u64(g, b);                                    \
    h = _mm_crc32_u64(h, c);                                    \
    i = _mm_crc32_u64(i, d);                                    \
    j = _mm_crc32_u64(j, e);                                    \
    s += 40

    CHUNK(1, 1); CHUNK(k0, 0);
    CHUNK(1, 1); CHUNK(k0, 0);
    CHUNK(1, 1); CHUNK(k0, 0);
  } while (--iters > 0);

  while (len >= 40) {
    CHUNK(k0, 0);
    len -= 40;
  }
  if (len > 0) {
    s = s + len - 40;
    CHUNK(k0, 0);
  }
  j += i << 32;
  a = HashLen16(a, j);
  h += g << 32;
  b += h;
  c = HashLen16(c, f) + i;
  d = HashLen16(d, e + result[0]);
  j += e;
  i += HashLen16(h, t);
  e = HashLen16(a, d) + j;
  f = HashLen16(b, c) + a;
  g = HashLen16(j, i) + c;
  result[0] = e + f + g + h;
  a = ShiftMix((a + g) * k0) * k0 + b;
  result[1] += a + result[0];
  a = ShiftMix(a * k0) * k0 + c;
  result[2] = a + result[1];
  a = ShiftMix((a + e) * k0) * k0;
  result[3] = a + result[2];
}